

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void Fl::belowmouse(Fl_Widget *o)

{
  int iVar1;
  Fl_Widget *pFVar2;
  int iVar3;
  Fl_Group *this;
  
  iVar1 = e_number;
  if (grab_ == (Fl_Window *)0x0) {
    if (belowmouse_ != o) {
      e_number = 4;
      this = (Fl_Group *)belowmouse_;
      pFVar2 = o;
      if (dnd_flag != '\0') {
        e_number = 0x16;
        pFVar2 = o;
      }
      while ((belowmouse_ = pFVar2, this != (Fl_Group *)0x0 &&
             (iVar3 = Fl_Widget::contains(&this->super_Fl_Widget,o), iVar3 == 0))) {
        (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,(ulong)(uint)e_number);
        this = *(Fl_Group **)((long)&this->super_Fl_Widget + 8);
        pFVar2 = belowmouse_;
      }
    }
    e_number = iVar1;
    return;
  }
  return;
}

Assistant:

void Fl::belowmouse(Fl_Widget *o) {
  if (grab()) return; // don't do anything while grab is on
  Fl_Widget *p = belowmouse_;
  if (o != p) {
    belowmouse_ = o;
    int old_event = e_number;
    e_number = dnd_flag ? FL_DND_LEAVE : FL_LEAVE;
    for (; p && !p->contains(o); p = p->parent()) {
      p->handle(e_number);
    }
    e_number = old_event;
  }
}